

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPIToolchains.cxx
# Opt level: O2

Value * __thiscall
anon_unknown.dwarf_1945710::Toolchains::DumpToolchainVariables
          (Value *__return_storage_ptr__,Toolchains *this,cmMakefile *mf,string *lang,
          vector<(anonymous_namespace)::ToolchainVariable,_std::allocator<(anonymous_namespace)::ToolchainVariable>_>
          *variables)

{
  string *psVar1;
  ToolchainVariable *variable;
  string *lang_00;
  
  Json::Value::Value(__return_storage_ptr__,objectValue);
  psVar1 = (string *)lang->_M_string_length;
  for (lang_00 = (string *)(lang->_M_dataplus)._M_p; lang_00 != psVar1;
      lang_00 = (string *)&lang_00[2]._M_string_length) {
    DumpToolchainVariable
              (this,(cmMakefile *)__return_storage_ptr__,(Value *)mf,lang_00,
               (ToolchainVariable *)variables);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value Toolchains::DumpToolchainVariables(
  cmMakefile const* mf, std::string const& lang,
  std::vector<ToolchainVariable> const& variables)
{
  Json::Value object = Json::objectValue;
  for (const auto& variable : variables) {
    this->DumpToolchainVariable(mf, object, lang, variable);
  }
  return object;
}